

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_vfs_open_w(ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_vfs_callbacks *pCallbacks;
  ma_vfs_file *pFile_local;
  ma_uint32 openMode_local;
  wchar_t *pFilePath_local;
  ma_vfs *pVFS_local;
  
  if (pFile == (ma_vfs_file *)0x0) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pFile = (ma_vfs_file)0x0;
    if (((pVFS == (ma_vfs *)0x0) || (pFilePath == (wchar_t *)0x0)) || (openMode == 0)) {
      pVFS_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (*(long *)((long)pVFS + 8) == 0) {
      pVFS_local._4_4_ = MA_NOT_IMPLEMENTED;
    }
    else {
      pVFS_local._4_4_ = (**(code **)((long)pVFS + 8))(pVFS,pFilePath,openMode,pFile);
    }
  }
  return pVFS_local._4_4_;
}

Assistant:

MA_API ma_result ma_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pVFS == NULL || pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onOpenW == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onOpenW(pVFS, pFilePath, openMode, pFile);
}